

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_extcomplex_flags
               (lyout *out,int level,lys_module *module,lys_ext_instance_complex *ext,LY_STMT stmt,
               char *val1_str,char *val2_str,uint16_t val1,uint16_t val2,int *content)

{
  int iVar1;
  ushort *puVar2;
  uint16_t *flags;
  char *str;
  char *val1_str_local;
  LY_STMT stmt_local;
  lys_ext_instance_complex *ext_local;
  lys_module *module_local;
  int level_local;
  lyout *out_local;
  
  puVar2 = (ushort *)lys_ext_complex_get_substmt(stmt,ext,(lyext_substmt **)0x0);
  if (puVar2 != (ushort *)0x0) {
    flags = (uint16_t *)val1_str;
    if ((val1 & *puVar2) == 0) {
      if ((val2 & *puVar2) == 0) {
        iVar1 = lys_ext_iter(ext->ext,ext->ext_size,'\0',stmt);
        if (iVar1 == -1) {
          return;
        }
      }
      else {
        flags = (uint16_t *)val2_str;
      }
    }
    yang_print_open(out,content);
    yang_print_substmt(out,level,stmt,'\0',(char *)flags,module,ext->ext,(uint)ext->ext_size);
  }
  return;
}

Assistant:

static void
yang_print_extcomplex_flags(struct lyout *out, int level, const struct lys_module *module,
                            struct lys_ext_instance_complex *ext, LY_STMT stmt,
                            const char *val1_str, const char *val2_str, uint16_t val1, uint16_t val2,
                            int *content)
{
    const char *str;
    uint16_t *flags;

    flags = lys_ext_complex_get_substmt(stmt, ext, NULL);
    if (!flags) {
        return;
    }

    if (val1 & *flags) {
        str = val1_str;
    } else if (val2 & *flags) {
        str = val2_str;
    } else if (lys_ext_iter(ext->ext, ext->ext_size, 0, (LYEXT_SUBSTMT)stmt) != -1) {
        /* flag not set, but since there are some extension, we are going to print the default value */
        str = val1_str;
    } else {
        return;
    }

    yang_print_open(out, content);
    yang_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, 0, str, module, ext->ext, ext->ext_size);
}